

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void BeginTextureMode(RenderTexture2D target)

{
  GLuint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000014;
  
  rlDrawRenderBatchActive();
  (*glad_glBindFramebuffer)(0x8d40,in_stack_00000008);
  (*glad_glViewport)(0,0,in_stack_00000010,in_stack_00000014);
  RLGL.State.framebufferWidth = in_stack_00000010;
  RLGL.State.framebufferHeight = in_stack_00000014;
  RLGL.State.currentMatrix = &RLGL.State.projection;
  RLGL.State.currentMatrixMode = 0x1701;
  rlLoadIdentity();
  rlOrtho(0.0,(double)(int)in_stack_00000010,(double)(int)in_stack_00000014,0.0,0.0,1.0);
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  RLGL.State.currentMatrixMode = 0x1700;
  rlLoadIdentity();
  CORE.Window.currentFbo.width = in_stack_00000010;
  CORE.Window.currentFbo.height = in_stack_00000014;
  CORE.Window.usingFbo = true;
  return;
}

Assistant:

void BeginTextureMode(RenderTexture2D target)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlEnableFramebuffer(target.id); // Enable render target

    // Set viewport and RLGL internal framebuffer size
    rlViewport(0, 0, target.texture.width, target.texture.height);
    rlSetFramebufferWidth(target.texture.width);
    rlSetFramebufferHeight(target.texture.height);

    rlMatrixMode(RL_PROJECTION);    // Switch to projection matrix
    rlLoadIdentity();               // Reset current matrix (projection)

    // Set orthographic projection to current framebuffer size
    // NOTE: Configured top-left corner as (0, 0)
    rlOrtho(0, target.texture.width, target.texture.height, 0, 0.0f, 1.0f);

    rlMatrixMode(RL_MODELVIEW);     // Switch back to modelview matrix
    rlLoadIdentity();               // Reset current matrix (modelview)

    //rlScalef(0.0f, -1.0f, 0.0f);  // Flip Y-drawing (?)

    // Setup current width/height for proper aspect ratio
    // calculation when using BeginMode3D()
    CORE.Window.currentFbo.width = target.texture.width;
    CORE.Window.currentFbo.height = target.texture.height;
    CORE.Window.usingFbo = true;
}